

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_esni_init_context
              (ptls_context_t *ctx,ptls_esni_context_t *esni,ptls_iovec_t esni_keys,
              ptls_key_exchange_context_t **key_exchanges)

{
  ptls_key_exchange_context_t *ppVar1;
  uint8_t *puVar2;
  long local_180;
  size_t i_1;
  uint8_t *end_6;
  uint8_t *_src_5;
  uint64_t _block_size64_5;
  size_t _block_size_5;
  size_t _capacity_5;
  uint8_t *puStack_148;
  uint16_t ext_type;
  uint8_t *end_5;
  uint8_t *_src_4;
  uint64_t _block_size64_4;
  size_t _block_size_4;
  size_t _capacity_4;
  size_t i;
  ptls_key_exchange_context_t *ppStack_110;
  uint16_t id_1;
  void *newp;
  uint8_t *end_4;
  uint8_t *_src_3;
  uint64_t _block_size64_3;
  size_t _block_size_3;
  size_t _capacity_3;
  ptls_key_exchange_context_t **found;
  uint8_t *end_3;
  uint8_t *_src_2;
  uint64_t _block_size64_2;
  size_t _block_size_2;
  size_t _capacity_2;
  ptls_key_exchange_context_t **pppStack_a8;
  uint16_t id;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  long lStack_50;
  int ret;
  size_t num_cipher_suites;
  size_t num_key_exchanges;
  uint8_t *end;
  uint8_t *src;
  ptls_key_exchange_context_t **key_exchanges_local;
  ptls_esni_context_t *esni_local;
  ptls_context_t *ctx_local;
  ptls_iovec_t esni_keys_local;
  
  esni_keys_local.base = (uint8_t *)esni_keys.len;
  end = esni_keys.base;
  num_key_exchanges = (size_t)(esni_keys_local.base + (long)&((ptls_context_t *)end)->random_bytes);
  lStack_50 = 0;
  for (num_cipher_suites = 0; key_exchanges[num_cipher_suites] != (ptls_key_exchange_context_t *)0x0
      ; num_cipher_suites = num_cipher_suites + 1) {
  }
  src = (uint8_t *)key_exchanges;
  key_exchanges_local = (ptls_key_exchange_context_t **)esni;
  esni_local = (ptls_esni_context_t *)ctx;
  ctx_local = (ptls_context_t *)end;
  memset(esni,0,0x30);
  ppVar1 = (ptls_key_exchange_context_t *)malloc((num_cipher_suites + 1) * 8);
  *key_exchanges_local = ppVar1;
  if (ppVar1 == (ptls_key_exchange_context_t *)0x0) {
    _capacity._4_4_ = 0x201;
  }
  else {
    memcpy(*key_exchanges_local,src,(num_cipher_suites + 1) * 8);
    _capacity._4_4_ =
         ptls_decode16((uint16_t *)(key_exchanges_local + 5),&end,(uint8_t *)num_key_exchanges);
    if (_capacity._4_4_ == 0) {
      if ((long)(num_key_exchanges - (long)end) < 4) {
        _capacity._4_4_ = 0x33;
      }
      else {
        end = end + 4;
        _block_size = 2;
        if (num_key_exchanges - (long)end < 2) {
          _capacity._4_4_ = 0x32;
        }
        else {
          _block_size64 = 0;
          do {
            puVar2 = end + 1;
            _block_size64 = _block_size64 << 8 | (ulong)*end;
            _block_size = _block_size - 1;
            end = puVar2;
          } while (_block_size != 0);
          _block_size = 0;
          if (num_key_exchanges - (long)puVar2 < _block_size64) {
            _capacity._4_4_ = 0x32;
          }
          else {
            _capacity_1 = (size_t)(puVar2 + _block_size64);
            _block_size_1 = 2;
            if (num_key_exchanges - _capacity_1 < 2) {
              _capacity._4_4_ = 0x32;
              end = (uint8_t *)_capacity_1;
            }
            else {
              _block_size64_1 = 0;
              end = (uint8_t *)_capacity_1;
              do {
                puVar2 = end + 1;
                _block_size64_1 = _block_size64_1 << 8 | (ulong)*end;
                _block_size_1 = _block_size_1 - 1;
                end = puVar2;
              } while (_block_size_1 != 0);
              _block_size_1 = 0;
              if (num_key_exchanges - (long)puVar2 < _block_size64_1) {
                _capacity._4_4_ = 0x32;
              }
              else {
                pppStack_a8 = (ptls_key_exchange_context_t **)(puVar2 + _block_size64_1);
                do {
                  _capacity._4_4_ = 0;
                  _capacity._4_4_ =
                       ptls_decode16((uint16_t *)((long)&_capacity_2 + 6),&end,
                                     (uint8_t *)pppStack_a8);
                  if (_capacity._4_4_ != 0) goto LAB_0011375f;
                  _block_size_2 = 2;
                  if ((ulong)((long)pppStack_a8 - (long)end) < 2) {
                    _capacity._4_4_ = 0x32;
                    goto LAB_0011375f;
                  }
                  _block_size64_2 = 0;
                  do {
                    puVar2 = end + 1;
                    _block_size64_2 = _block_size64_2 << 8 | (ulong)*end;
                    _block_size_2 = _block_size_2 - 1;
                    end = puVar2;
                  } while (_block_size_2 != 0);
                  _block_size_2 = 0;
                  if ((ulong)((long)pppStack_a8 - (long)puVar2) < _block_size64_2) {
                    _capacity._4_4_ = 0x32;
                    goto LAB_0011375f;
                  }
                  found = (ptls_key_exchange_context_t **)(puVar2 + _block_size64_2);
                  for (_capacity_3 = (size_t)src;
                      (*(long *)_capacity_3 != 0 &&
                      (*(short *)**(undefined8 **)_capacity_3 != _capacity_2._6_2_));
                      _capacity_3 = _capacity_3 + 8) {
                  }
                  if (_capacity_3 == 0) {
                    _capacity._4_4_ = 0x204;
                    end = (uint8_t *)found;
                    goto LAB_0011375f;
                  }
                  end = (uint8_t *)found;
                } while (found != pppStack_a8);
                if (found == pppStack_a8) {
                  _block_size_3 = 2;
                  if (num_key_exchanges - (long)found < 2) {
                    _capacity._4_4_ = 0x32;
                  }
                  else {
                    _block_size64_3 = 0;
                    end = (uint8_t *)found;
                    do {
                      puVar2 = end + 1;
                      _block_size64_3 = _block_size64_3 << 8 | (ulong)*end;
                      _block_size_3 = _block_size_3 - 1;
                      end = puVar2;
                    } while (_block_size_3 != 0);
                    _block_size_3 = 0;
                    if (num_key_exchanges - (long)puVar2 < _block_size64_3) {
                      _capacity._4_4_ = 0x32;
                    }
                    else {
                      newp = puVar2 + _block_size64_3;
                      _capacity._4_4_ = 0;
                      do {
                        _capacity._4_4_ =
                             ptls_decode16((uint16_t *)((long)&i + 6),&end,(uint8_t *)newp);
                        if (_capacity._4_4_ != 0) goto LAB_0011375f;
                        _capacity_4 = 0;
                        while ((*(long *)(esni_local->not_before + _capacity_4 * 8) != 0 &&
                               (**(short **)(esni_local->not_before + _capacity_4 * 8) != i._6_2_)))
                        {
                          _capacity_4 = _capacity_4 + 1;
                        }
                        if (*(long *)(esni_local->not_before + _capacity_4 * 8) != 0) {
                          ppStack_110 = (ptls_key_exchange_context_t *)
                                        realloc(key_exchanges_local[1],(lStack_50 + 1) * 0x48);
                          if (ppStack_110 == (ptls_key_exchange_context_t *)0x0) {
                            _capacity._4_4_ = 0x201;
                            goto LAB_0011375f;
                          }
                          key_exchanges_local[1] = ppStack_110;
                          *(undefined8 *)((long)key_exchanges_local[1] + lStack_50 * 0x48) =
                               *(undefined8 *)(esni_local->not_before + _capacity_4 * 8);
                          lStack_50 = lStack_50 + 1;
                        }
                      } while (end != (uint8_t *)newp);
                      ppStack_110 = (ptls_key_exchange_context_t *)
                                    realloc(key_exchanges_local[1],(lStack_50 + 1) * 0x48);
                      if (ppStack_110 == (ptls_key_exchange_context_t *)0x0) {
                        _capacity._4_4_ = 0x201;
                      }
                      else {
                        key_exchanges_local[1] = ppStack_110;
                        *(undefined8 *)((long)key_exchanges_local[1] + lStack_50 * 0x48) = 0;
                        if (end == (uint8_t *)newp) {
                          _capacity._4_4_ =
                               ptls_decode16((uint16_t *)(key_exchanges_local + 2),&end,
                                             (uint8_t *)num_key_exchanges);
                          if (((_capacity._4_4_ == 0) &&
                              (_capacity._4_4_ =
                                    ptls_decode64((uint64_t *)(key_exchanges_local + 3),&end,
                                                  (uint8_t *)num_key_exchanges),
                              _capacity._4_4_ == 0)) &&
                             (_capacity._4_4_ =
                                   ptls_decode64((uint64_t *)(key_exchanges_local + 4),&end,
                                                 (uint8_t *)num_key_exchanges), _capacity._4_4_ == 0
                             )) {
                            _block_size_4 = 2;
                            if (num_key_exchanges - (long)end < 2) {
                              _capacity._4_4_ = 0x32;
                            }
                            else {
                              _block_size64_4 = 0;
                              do {
                                puVar2 = end + 1;
                                _block_size64_4 = _block_size64_4 << 8 | (ulong)*end;
                                _block_size_4 = _block_size_4 - 1;
                                end = puVar2;
                              } while (_block_size_4 != 0);
                              _block_size_4 = 0;
                              if (num_key_exchanges - (long)puVar2 < _block_size64_4) {
                                _capacity._4_4_ = 0x32;
                              }
                              else {
                                puStack_148 = puVar2 + _block_size64_4;
                                while (_capacity._4_4_ = 0, end != puStack_148) {
                                  _capacity._4_4_ =
                                       ptls_decode16((uint16_t *)((long)&_capacity_5 + 6),&end,
                                                     puStack_148);
                                  if (_capacity._4_4_ != 0) goto LAB_0011375f;
                                  _block_size_5 = 2;
                                  if ((ulong)((long)puStack_148 - (long)end) < 2) {
                                    _capacity._4_4_ = 0x32;
                                    goto LAB_0011375f;
                                  }
                                  _block_size64_5 = 0;
                                  do {
                                    puVar2 = end + 1;
                                    _block_size64_5 = _block_size64_5 << 8 | (ulong)*end;
                                    _block_size_5 = _block_size_5 - 1;
                                    end = puVar2;
                                  } while (_block_size_5 != 0);
                                  if ((ulong)((long)puStack_148 - (long)puVar2) < _block_size64_5) {
                                    _capacity._4_4_ = 0x32;
                                    goto LAB_0011375f;
                                  }
                                  end = puVar2 + _block_size64_5;
                                }
                                if (end == puStack_148) {
                                  if (end == (uint8_t *)num_key_exchanges) {
                                    for (local_180 = 0; _capacity._4_4_ = 0,
                                        *(long *)((long)key_exchanges_local[1] + local_180 * 0x48)
                                        != 0; local_180 = local_180 + 1) {
                                      _capacity._4_4_ =
                                           ptls_calc_hash(*(ptls_hash_algorithm_t **)
                                                           (*(long *)((long)key_exchanges_local[1] +
                                                                     local_180 * 0x48) + 0x10),
                                                          (void *)((long)key_exchanges_local[1] +
                                                                  local_180 * 0x48 + 8),ctx_local,
                                                          (size_t)esni_keys_local.base);
                                      if (_capacity._4_4_ != 0) goto LAB_0011375f;
                                    }
                                    _capacity._4_4_ = 0;
                                  }
                                  else {
                                    _capacity._4_4_ = 0x32;
                                  }
                                }
                                else {
                                  _capacity._4_4_ = 0x32;
                                }
                              }
                            }
                          }
                        }
                        else {
                          _capacity._4_4_ = 0x32;
                        }
                      }
                    }
                  }
                }
                else {
                  _capacity._4_4_ = 0x32;
                  end = (uint8_t *)found;
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0011375f:
  if (_capacity._4_4_ != 0) {
    ptls_esni_dispose_context((ptls_esni_context_t *)key_exchanges_local);
  }
  return _capacity._4_4_;
}

Assistant:

int ptls_esni_init_context(ptls_context_t *ctx, ptls_esni_context_t *esni, ptls_iovec_t esni_keys,
                           ptls_key_exchange_context_t **key_exchanges)
{
    const uint8_t *src = esni_keys.base, *const end = src + esni_keys.len;
    size_t num_key_exchanges, num_cipher_suites = 0;
    int ret;

    for (num_key_exchanges = 0; key_exchanges[num_key_exchanges] != NULL; ++num_key_exchanges)
        ;

    memset(esni, 0, sizeof(*esni));
    if ((esni->key_exchanges = malloc(sizeof(*esni->key_exchanges) * (num_key_exchanges + 1))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    memcpy(esni->key_exchanges, key_exchanges, sizeof(*esni->key_exchanges) * (num_key_exchanges + 1));

    /* ESNIKeys */
    if ((ret = ptls_decode16(&esni->version, &src, end)) != 0)
        goto Exit;
    /* Skip checksum fields */
    if (end - src < 4) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    src += 4;
    /* Published SNI field */
    ptls_decode_open_block(src, end, 2, { src = end; });

    /* Process the list of KeyShareEntries, verify for each of them that the ciphersuite is supported. */
    ptls_decode_open_block(src, end, 2, {
        do {
            /* parse */
            uint16_t id;
            if ((ret = ptls_decode16(&id, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, { src = end; });
            /* check that matching key-share exists */
            ptls_key_exchange_context_t **found;
            for (found = key_exchanges; *found != NULL; ++found)
                if ((*found)->algo->id == id)
                    break;
            if (found == NULL) {
                ret = PTLS_ERROR_INCOMPATIBLE_KEY;
                goto Exit;
            }
        } while (src != end);
    });
    /* Process the list of cipher_suites. If they are supported, store in esni context  */
    ptls_decode_open_block(src, end, 2, {
        void *newp;
        do {
            uint16_t id;
            if ((ret = ptls_decode16(&id, &src, end)) != 0)
                goto Exit;
            size_t i;
            for (i = 0; ctx->cipher_suites[i] != NULL; ++i)
                if (ctx->cipher_suites[i]->id == id)
                    break;
            if (ctx->cipher_suites[i] != NULL) {
                if ((newp = realloc(esni->cipher_suites, sizeof(*esni->cipher_suites) * (num_cipher_suites + 1))) == NULL) {
                    ret = PTLS_ERROR_NO_MEMORY;
                    goto Exit;
                }
                esni->cipher_suites = newp;
                esni->cipher_suites[num_cipher_suites++].cipher_suite = ctx->cipher_suites[i];
            }
        } while (src != end);
        if ((newp = realloc(esni->cipher_suites, sizeof(*esni->cipher_suites) * (num_cipher_suites + 1))) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        esni->cipher_suites = newp;
        esni->cipher_suites[num_cipher_suites].cipher_suite = NULL;
    });
    /* Parse the padded length, not before, not after parameters */
    if ((ret = ptls_decode16(&esni->padded_length, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode64(&esni->not_before, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode64(&esni->not_after, &src, end)) != 0)
        goto Exit;
    /* Skip the extension fields */
    ptls_decode_block(src, end, 2, {
        while (src != end) {
            uint16_t ext_type;
            if ((ret = ptls_decode16(&ext_type, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, { src = end; });
        }
    });

    { /* calculate digests for every cipher-suite */
        size_t i;
        for (i = 0; esni->cipher_suites[i].cipher_suite != NULL; ++i) {
            if ((ret = ptls_calc_hash(esni->cipher_suites[i].cipher_suite->hash, esni->cipher_suites[i].record_digest,
                                      esni_keys.base, esni_keys.len)) != 0)
                goto Exit;
        }
    }

    ret = 0;
Exit:
    if (ret != 0)
        ptls_esni_dispose_context(esni);
    return ret;
}